

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c++
# Opt level: O3

Promise<kj::Own<kj::NetworkAddress,_std::nullptr_t>_> __thiscall
kj::TlsNetwork::parseAddress(TlsNetwork *this,StringPtr addr,uint portHint)

{
  ArrayDisposer *pAVar1;
  ArrayDisposer *pAVar2;
  OwnPromiseNode node;
  char *pcVar3;
  PromiseBase PVar4;
  void *pvVar5;
  ulong uVar6;
  uint uVar7;
  undefined4 in_register_0000000c;
  size_t sVar8;
  long *value;
  size_t sVar9;
  char *pcVar10;
  undefined4 in_R8D;
  ulong __n;
  String result;
  String hostname;
  OwnPromiseNode local_68;
  undefined4 local_5c;
  char *local_58;
  PromiseBase local_50;
  StringPtr addr_local;
  void *continuationTracePtr;
  
  sVar8 = CONCAT44(in_register_0000000c,portHint);
  value = (long *)addr.content.size_;
  local_58 = addr.content.ptr;
  __n = sVar8 - 1;
  local_5c = in_R8D;
  local_50.node.ptr = (OwnPromiseNode)(OwnPromiseNode)this;
  addr_local.content.ptr = (char *)value;
  addr_local.content.size_ = sVar8;
  if (__n != 0) {
    if ((char)*value == '[') {
      pvVar5 = memchr(value,0x5d,__n);
      if (pvVar5 == (void *)0x0) {
        heapString(&result,(char *)value,__n);
      }
      else {
        sVar9 = (long)pvVar5 + ~(ulong)value;
        heapString(&result,sVar9);
        if (sVar9 != 0) {
          pcVar10 = (char *)result.content.size_;
          if (result.content.size_ != 0) {
            pcVar10 = result.content.ptr;
          }
          memcpy(pcVar10,(void *)((long)value + 1),sVar9);
        }
      }
      goto LAB_004851d7;
    }
    if ((4 < __n) &&
       ((*(char *)((long)value + 4) == ':' && (int)*value == 0x78696e75 ||
        ((0xd < __n &&
         (*(long *)((long)value + 6) == 0x3a74636172747362 && *value == 0x7362612d78696e75)))))) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[47],kj::StringPtr&>
                ((Fault *)&result,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/tls.c++"
                 ,0x2ae,FAILED,(char *)0x0,
                 "\"can\'t authenticate Unix domain socket with TLS\", addr",
                 (char (*) [47])"can\'t authenticate Unix domain socket with TLS",&addr_local);
      kj::_::Debug::Fault::fatal((Fault *)&result);
    }
  }
  if ((long *)((long)value + (sVar8 - 1)) != value) {
    uVar6 = 0;
    uVar7 = 0;
    do {
      uVar7 = uVar7 + (*(char *)((long)value + uVar6) == ':');
      uVar6 = uVar6 + 1;
    } while (__n != uVar6);
    if (1 < uVar7) {
      heapString(&result,(char *)value,__n);
      goto LAB_004851d7;
    }
  }
  pvVar5 = memchr(value,0x3a,__n);
  if (pvVar5 == (void *)0x0) {
    heapString(&result,(char *)value,__n);
  }
  else {
    heapString(&result,(char *)value,(long)pvVar5 - (long)value);
  }
LAB_004851d7:
  pcVar3 = local_58;
  pAVar1 = result.content.disposer;
  sVar9 = result.content.size_;
  pcVar10 = result.content.ptr;
  (**(code **)**(undefined8 **)(local_58 + 0x10))
            (&local_68,*(undefined8 **)(local_58 + 0x10),value,sVar8,local_5c);
  PVar4.node.ptr = local_50.node.ptr;
  result.content.ptr = pcVar3;
  result.content.size_ = (size_t)pcVar10;
  result.content.disposer = (ArrayDisposer *)sVar9;
  continuationTracePtr =
       kj::_::
       SimpleTransformPromiseNode<kj::Own<kj::NetworkAddress,_std::nullptr_t>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/tls.c++:716:15)>
       ::anon_class_32_2_2106826e_for_func::operator();
  kj::_::PromiseDisposer::
  appendPromise<kj::_::SimpleTransformPromiseNode<kj::Own<kj::NetworkAddress,decltype(nullptr)>,kj::TlsNetwork::parseAddress(kj::StringPtr,unsigned_int)::_lambda(kj::Own<kj::NetworkAddress,decltype(nullptr)>&&)_1_>,kj::_::PromiseDisposer,kj::TlsNetwork::parseAddress(kj::StringPtr,unsigned_int)::_lambda(kj::Own<kj::NetworkAddress,decltype(nullptr)>&&)_1_,void*&>
            ((PromiseDisposer *)local_50.node.ptr,&local_68,
             (anon_class_32_2_2106826e_for_func *)&result,&continuationTracePtr);
  pAVar2 = result.content.disposer;
  sVar8 = result.content.size_;
  if (result.content.size_ != 0) {
    result.content.size_ = 0;
    result.content.disposer = (ArrayDisposer *)0x0;
    (**pAVar1->_vptr_ArrayDisposer)(pAVar1,sVar8,1,pAVar2,pAVar2,0);
  }
  node.ptr = local_68.ptr;
  if (&(local_68.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
    local_68.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(node.ptr)->super_PromiseArenaMember);
  }
  return (Promise<kj::Own<kj::NetworkAddress,_std::nullptr_t>_>)(PromiseNode *)PVar4.node.ptr;
}

Assistant:

Promise<Own<NetworkAddress>> parseAddress(StringPtr addr, uint portHint) override {
    // We want to parse the hostname or IP address out of `addr`. This is a bit complicated as
    // KJ's default network implementation has a fairly featureful grammar for these things.
    // In particular, we cannot just split on ':' because the address might be IPv6.

    kj::String hostname;

    if (addr.startsWith("[")) {
      // IPv6, like "[1234:5678::abcd]:123". Take the part between the brackets.
      KJ_IF_SOME(pos, addr.findFirst(']')) {
        hostname = kj::str(addr.slice(1, pos));
      } else {
        // Uhh??? Just take the whole thing, cert will fail later.
        hostname = kj::heapString(addr);
      }
    }